

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O3

bool __thiscall glslang::HlslGrammar::acceptCaseLabel(HlslGrammar *this,TIntermNode **statement)

{
  bool bVar1;
  TIntermBranch *pTVar2;
  char *pcVar3;
  HlslParseContext *pHVar4;
  _func_int **pp_Var5;
  TIntermTyped *expression;
  TSourceLoc loc;
  TIntermTyped *local_40;
  TSourceLoc local_38;
  
  local_38.column = (this->super_HlslTokenStream).token.loc.column;
  local_38._20_4_ = *(undefined4 *)&(this->super_HlslTokenStream).token.loc.field_0x14;
  local_38.name = (this->super_HlslTokenStream).token.loc.name;
  local_38.string = (this->super_HlslTokenStream).token.loc.string;
  local_38.line = (this->super_HlslTokenStream).token.loc.line;
  bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokCase);
  if (bVar1) {
    bVar1 = acceptExpression(this,&local_40);
    if (bVar1) {
      bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokColon);
      pHVar4 = this->parseContext;
      if (bVar1) {
        pTVar2 = TIntermediate::addBranch
                           ((pHVar4->super_TParseContextBase).super_TParseVersions.intermediate,
                            EOpCase,local_40,&local_38);
        *statement = &pTVar2->super_TIntermNode;
        return true;
      }
      pp_Var5 = (pHVar4->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar3 = ":";
    }
    else {
      pHVar4 = this->parseContext;
      pp_Var5 = (pHVar4->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar3 = "case expression";
    }
    (*pp_Var5[0x2d])(pHVar4,&(this->super_HlslTokenStream).token,"Expected",pcVar3,"");
  }
  return false;
}

Assistant:

bool HlslGrammar::acceptCaseLabel(TIntermNode*& statement)
{
    TSourceLoc loc = token.loc;
    if (! acceptTokenClass(EHTokCase))
        return false;

    TIntermTyped* expression;
    if (! acceptExpression(expression)) {
        expected("case expression");
        return false;
    }

    if (! acceptTokenClass(EHTokColon)) {
        expected(":");
        return false;
    }

    statement = parseContext.intermediate.addBranch(EOpCase, expression, loc);

    return true;
}